

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)4,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ims<2> local_50;
  int local_4c;
  Imd local_44;
  int local_40;
  undefined1 local_38 [8];
  Ea<(moira::Mode)2,_2> dst;
  u8 src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  dst.ext2._1_1_ = (byte)((int)(uint)op >> 9) & 7;
  dst.ext2._2_2_ = op;
  unique0x10000184 = addr;
  Op<(moira::Mode)2,2>((Ea<(moira::Mode)2,_2> *)local_38,this,op & 7,addr);
  if (dst.ext2._1_1_ == 0) {
    dst.ext2._1_1_ = 8;
  }
  if (str->style->syntax == MUSASHI) {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_40 = (str->tab).raw;
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_40);
    Imd::Imd(&local_44,(uint)dst.ext2._1_1_);
    pSVar1 = StrWriter::operator<<(pSVar1,local_44);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)2,_2> *)local_38);
  }
  else {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_4c = (str->tab).raw;
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_4c);
    Ims<2>::Ims(&local_50,(uint)dst.ext2._1_1_);
    pSVar1 = StrWriter::operator<<(pSVar1,local_50);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)2,_2> *)local_38);
  }
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src =          ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << dst;
    }
}